

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time_facet.h
# Opt level: O0

void __thiscall booster::locale::calendar_facet::~calendar_facet(calendar_facet *this)

{
  facet *in_RDI;
  
  std::locale::facet::~facet(in_RDI);
  return;
}

Assistant:

class BOOSTER_API calendar_facet : public std::locale::facet {
        public:
            ///
            /// Basic constructor
            ///
            calendar_facet(size_t refs = 0) : std::locale::facet(refs) 
            {
            }
            ///
            /// Create a new calendar that points to current point of time.
            ///
            virtual abstract_calendar *create_calendar() const = 0;

            ///
            /// Locale id (needed to work with std::locale)
            ///
            static std::locale::id id;
        }